

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineNurbs.cpp
# Opt level: O1

void __thiscall chrono::geometry::ChLineNurbs::ArchiveIN(ChLineNurbs *this,ChArchiveIn *marchive)

{
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_38;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChLineNurbs>(marchive);
  ChLine::ArchiveIN(&this->super_ChLine,marchive);
  local_38._value = &this->points;
  local_38._name = "points";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)&this->p;
  local_38._name = "p";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  return;
}

Assistant:

void ChLineNurbs::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLineNurbs>();
    // deserialize parent class
    ChLine::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(points);
    ////marchive >> CHNVP(weights); //**TODO MATRIX DESERIALIZATION
    ////marchive >> CHNVP(knots); //**TODO MATRIX DESERIALIZATION
    marchive >> CHNVP(p);
}